

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  ulong uVar1;
  RawBufferView *pRVar2;
  float *pfVar3;
  Vec3fx *pVVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  PrimRef *pPVar8;
  bool bVar9;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  float fVar20;
  ulong uVar21;
  size_t *psVar22;
  ulong uVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar38;
  undefined1 auVar37 [16];
  
  aVar24 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar25 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar25;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar21 = r->_begin;
  sVar19 = __return_storage_ptr__->end;
  aVar26 = aVar25;
  aVar27 = aVar24;
  if (uVar21 < r->_end) {
    uVar1 = itime + 1;
    aVar10 = DAT_01feb9f0._0_12_;
    do {
      fVar20 = (float)uVar21;
      uVar18 = uVar21 & 0xffffffff;
      pBVar5 = (this->super_Points).vertices.items;
      uVar23 = (pBVar5->super_RawBufferView).num;
      fVar34 = -INFINITY;
      fVar35 = -INFINITY;
      fVar36 = -INFINITY;
      aVar28 = aVar10;
      if (uVar18 < uVar23) {
        pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
        pfVar3 = (float *)(pcVar6 + pBVar5[itime].super_RawBufferView.stride * uVar18);
        fVar38 = pfVar3[3];
        auVar29._4_4_ = -(uint)(pfVar3[1] <= -1.844e+18);
        auVar29._0_4_ = -(uint)(*pfVar3 <= -1.844e+18);
        auVar29._8_4_ = -(uint)(pfVar3[2] <= -1.844e+18);
        auVar29._12_4_ = -(uint)(fVar38 <= -1.844e+18);
        bVar9 = false;
        if ((0.0 <= fVar38) &&
           (auVar11._4_4_ = -(uint)(1.844e+18 <= pfVar3[1]),
           auVar11._0_4_ = -(uint)(1.844e+18 <= *pfVar3),
           auVar11._8_4_ = -(uint)(1.844e+18 <= pfVar3[2]),
           auVar11._12_4_ = -(uint)(1.844e+18 <= fVar38),
           uVar16 = movmskps((int)pcVar6,auVar29 | auVar11), (char)uVar16 == '\0')) {
          psVar22 = &pBVar5[itime + 1].super_RawBufferView.stride;
          sVar17 = itime;
          do {
            sVar17 = sVar17 + 1;
            bVar9 = itime < sVar17;
            if (itime < sVar17) {
              if (uVar18 < uVar23) goto LAB_00ac9a24;
              goto LAB_00ac9b1f;
            }
            sVar7 = *psVar22;
            pfVar3 = (float *)(((RawBufferView *)(psVar22 + -2))->ptr_ofs + sVar7 * uVar18);
            fVar38 = pfVar3[3];
            auVar30._4_4_ = -(uint)(pfVar3[1] <= -1.844e+18);
            auVar30._0_4_ = -(uint)(*pfVar3 <= -1.844e+18);
            auVar30._8_4_ = -(uint)(pfVar3[2] <= -1.844e+18);
            auVar30._12_4_ = -(uint)(fVar38 <= -1.844e+18);
            if (fVar38 < 0.0) break;
            psVar22 = psVar22 + 7;
            auVar12._4_4_ = -(uint)(1.844e+18 <= pfVar3[1]);
            auVar12._0_4_ = -(uint)(1.844e+18 <= *pfVar3);
            auVar12._8_4_ = -(uint)(1.844e+18 <= pfVar3[2]);
            auVar12._12_4_ = -(uint)(1.844e+18 <= fVar38);
            uVar16 = movmskps((int)(sVar7 * uVar18),auVar30 | auVar12);
          } while ((char)uVar16 == '\0');
        }
        if (!(bool)(uVar18 < uVar23 & bVar9)) goto LAB_00ac9b1f;
LAB_00ac9a24:
        pcVar6 = pBVar5[uVar1].super_RawBufferView.ptr_ofs;
        pfVar3 = (float *)(pcVar6 + pBVar5[uVar1].super_RawBufferView.stride * uVar18);
        fVar38 = pfVar3[3];
        auVar31._4_4_ = -(uint)(pfVar3[1] <= -1.844e+18);
        auVar31._0_4_ = -(uint)(*pfVar3 <= -1.844e+18);
        auVar31._8_4_ = -(uint)(pfVar3[2] <= -1.844e+18);
        auVar31._12_4_ = -(uint)(fVar38 <= -1.844e+18);
        bVar9 = false;
        if (fVar38 < 0.0) goto LAB_00ac9b1f;
        auVar13._4_4_ = -(uint)(1.844e+18 <= pfVar3[1]);
        auVar13._0_4_ = -(uint)(1.844e+18 <= *pfVar3);
        auVar13._8_4_ = -(uint)(1.844e+18 <= pfVar3[2]);
        auVar13._12_4_ = -(uint)(1.844e+18 <= fVar38);
        uVar16 = movmskps((int)pcVar6,auVar31 | auVar13);
        if ((char)uVar16 == '\0') {
          psVar22 = &pBVar5[itime + 2].super_RawBufferView.stride;
          uVar23 = uVar1;
          do {
            uVar23 = uVar23 + 1;
            if (uVar1 < uVar23) goto LAB_00ac9ad4;
            pRVar2 = (RawBufferView *)(psVar22 + -2);
            pfVar3 = (float *)(pRVar2->ptr_ofs + *psVar22 * uVar18);
            fVar38 = pfVar3[3];
            auVar32._4_4_ = -(uint)(pfVar3[1] <= -1.844e+18);
            auVar32._0_4_ = -(uint)(*pfVar3 <= -1.844e+18);
            auVar32._8_4_ = -(uint)(pfVar3[2] <= -1.844e+18);
            auVar32._12_4_ = -(uint)(fVar38 <= -1.844e+18);
            if (fVar38 < 0.0) break;
            psVar22 = psVar22 + 7;
            auVar14._4_4_ = -(uint)(1.844e+18 <= pfVar3[1]);
            auVar14._0_4_ = -(uint)(1.844e+18 <= *pfVar3);
            auVar14._8_4_ = -(uint)(1.844e+18 <= pfVar3[2]);
            auVar14._12_4_ = -(uint)(1.844e+18 <= fVar38);
            uVar16 = movmskps((int)pRVar2->ptr_ofs,auVar32 | auVar14);
          } while ((char)uVar16 == '\0');
          if (uVar23 <= uVar1) goto LAB_00ac9b1f;
LAB_00ac9ad4:
          auVar29 = *(undefined1 (*) [16])
                     (pBVar5[itime].super_RawBufferView.ptr_ofs +
                     pBVar5[itime].super_RawBufferView.stride * uVar21);
          fVar38 = auVar29._12_4_;
          fVar36 = (this->super_Points).maxRadiusScale;
          aVar28.x = auVar29._0_4_ - fVar36 * fVar38;
          aVar28.y = auVar29._4_4_ - fVar36 * fVar38;
          aVar28.z = auVar29._8_4_ - fVar36 * fVar38;
          bVar9 = true;
          fVar34 = fVar36 * fVar38 + auVar29._0_4_;
          fVar35 = fVar36 * fVar38 + auVar29._4_4_;
          fVar36 = fVar36 * fVar38 + auVar29._8_4_;
        }
      }
      else {
LAB_00ac9b1f:
        bVar9 = false;
      }
      sVar17 = k;
      if (bVar9) {
        aVar33.m128[3] = (float)geomID;
        aVar33._0_4_ = aVar28.x;
        aVar33._4_4_ = aVar28.y;
        aVar33._8_4_ = aVar28.z;
        aVar24.m128 = (__m128)minps(aVar24.m128,aVar33.m128);
        auVar15._4_4_ = fVar35;
        auVar15._0_4_ = fVar34;
        auVar15._8_4_ = fVar36;
        auVar15._12_4_ = fVar20;
        aVar25.m128 = (__m128)maxps(aVar25.m128,auVar15);
        auVar37._0_4_ = aVar28.x + fVar34;
        auVar37._4_4_ = aVar28.y + fVar35;
        auVar37._8_4_ = aVar28.z + fVar36;
        auVar37._12_4_ = (float)geomID + fVar20;
        aVar27.m128 = (__m128)minps(aVar27.m128,auVar37);
        aVar26.m128 = (__m128)maxps(aVar26.m128,auVar37);
        sVar19 = sVar19 + 1;
        sVar17 = k + 1;
        pPVar8 = prims->items;
        pPVar8[k].lower.field_0 = aVar33;
        pVVar4 = &pPVar8[k].upper;
        (pVVar4->field_0).m128[0] = fVar34;
        (pVVar4->field_0).m128[1] = fVar35;
        (pVVar4->field_0).m128[2] = fVar36;
        (pVVar4->field_0).m128[3] = fVar20;
      }
      uVar21 = uVar21 + 1;
      k = sVar17;
    } while (uVar21 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar26;
  __return_storage_ptr__->end = sVar19;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }